

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchAig.c
# Opt level: O3

Aig_Man_t * Dch_DeriveTotalAig(Vec_Ptr_t *vAigs)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  long lVar7;
  int nNodesMax;
  long lVar8;
  
  if (vAigs->nSize < 1) {
    __assert_fail("Vec_PtrSize(vAigs) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchAig.c"
                  ,0x46,"Aig_Man_t *Dch_DeriveTotalAig(Vec_Ptr_t *)");
  }
  pvVar1 = *vAigs->pArray;
  lVar8 = 0;
  nNodesMax = 0;
  do {
    pAVar4 = (Aig_Man_t *)vAigs->pArray[lVar8];
    if (*(int *)((long)pvVar1 + 0x88) != pAVar4->nObjs[2]) {
      __assert_fail("Aig_ManCiNum(pAig) == Aig_ManCiNum(pAig2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchAig.c"
                    ,0x4c,"Aig_Man_t *Dch_DeriveTotalAig(Vec_Ptr_t *)");
    }
    if (*(int *)((long)pvVar1 + 0x8c) != pAVar4->nObjs[3]) {
      __assert_fail("Aig_ManCoNum(pAig) == Aig_ManCoNum(pAig2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchAig.c"
                    ,0x4d,"Aig_Man_t *Dch_DeriveTotalAig(Vec_Ptr_t *)");
    }
    nNodesMax = nNodesMax + pAVar4->nObjs[5] + pAVar4->nObjs[6];
    Aig_ManCleanData(pAVar4);
    lVar8 = lVar8 + 1;
  } while (lVar8 < vAigs->nSize);
  pAVar4 = Aig_ManStart(nNodesMax);
  if (0 < vAigs->nSize) {
    pAVar5 = pAVar4->pConst1;
    lVar8 = 0;
    do {
      *(Aig_Obj_t **)(*(long *)((long)vAigs->pArray[lVar8] + 0x30) + 0x28) = pAVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vAigs->nSize);
  }
  if (0 < *(int *)(*(long *)((long)pvVar1 + 0x10) + 4)) {
    lVar8 = 0;
    do {
      pAVar5 = Aig_ObjCreateCi(pAVar4);
      if (0 < vAigs->nSize) {
        lVar7 = 0;
        do {
          lVar2 = *(long *)((long)vAigs->pArray[lVar7] + 0x10);
          if (*(int *)(lVar2 + 4) <= lVar8) goto LAB_005e8bf7;
          *(Aig_Obj_t **)(*(long *)(*(long *)(lVar2 + 8) + lVar8 * 8) + 0x28) = pAVar5;
          lVar7 = lVar7 + 1;
        } while (lVar7 < vAigs->nSize);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)(*(long *)((long)pvVar1 + 0x10) + 4));
  }
  lVar8 = *(long *)((long)pvVar1 + 0x18);
  if (0 < *(int *)(lVar8 + 4)) {
    lVar7 = 0;
    do {
      uVar3 = *(ulong *)(*(long *)(lVar8 + 8) + lVar7 * 8);
      if (0 < vAigs->nSize) {
        lVar8 = 0;
        do {
          lVar2 = *(long *)((long)vAigs->pArray[lVar8] + 0x18);
          if (*(int *)(lVar2 + 4) <= lVar7) {
LAB_005e8bf7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Dch_DeriveTotalAig_rec
                    (pAVar4,(Aig_Obj_t *)
                            (*(ulong *)(*(long *)(*(long *)(lVar2 + 8) + lVar7 * 8) + 8) &
                            0xfffffffffffffffe));
          lVar8 = lVar8 + 1;
        } while (lVar8 < vAigs->nSize);
      }
      if ((uVar3 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar3 = *(ulong *)(uVar3 + 8);
      uVar6 = uVar3 & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      Aig_ObjCreateCo(pAVar4,pAVar5);
      lVar7 = lVar7 + 1;
      lVar8 = *(long *)((long)pvVar1 + 0x18);
    } while (lVar7 < *(int *)(lVar8 + 4));
  }
  return pAVar4;
}

Assistant:

Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs )
{
    Aig_Man_t * pAig, * pAig2, * pAigTotal;
    Aig_Obj_t * pObj, * pObjPi, * pObjPo;
    int i, k, nNodes;
    assert( Vec_PtrSize(vAigs) > 0 );
    // make sure they have the same number of PIs/POs
    nNodes = 0;
    pAig = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, i )
    {
        assert( Aig_ManCiNum(pAig) == Aig_ManCiNum(pAig2) );
        assert( Aig_ManCoNum(pAig) == Aig_ManCoNum(pAig2) );
        nNodes += Aig_ManNodeNum(pAig2);
        Aig_ManCleanData( pAig2 );
    }
    // map constant nodes
    pAigTotal = Aig_ManStart( nNodes );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
        Aig_ManConst1(pAig2)->pData = Aig_ManConst1(pAigTotal);
    // map primary inputs
    Aig_ManForEachCi( pAig, pObj, i )
    {
        pObjPi = Aig_ObjCreateCi( pAigTotal );
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
            Aig_ManCi( pAig2, i )->pData = pObjPi;
    }
    // construct the AIG in the order of POs
    Aig_ManForEachCo( pAig, pObj, i )
    {
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
        {
            pObjPo = Aig_ManCo( pAig2, i );
            Dch_DeriveTotalAig_rec( pAigTotal, Aig_ObjFanin0(pObjPo) );
        }
        Aig_ObjCreateCo( pAigTotal, Aig_ObjChild0Copy(pObj) );
    }
/*
    // mark the cone of the first AIG
    Aig_ManIncrementTravId( pAigTotal );
    Aig_ManForEachObj( pAig, pObj, i )
        if ( pObj->pData ) 
            Aig_ObjSetTravIdCurrent( pAigTotal, pObj->pData );
*/
    // cleanup should not be done
    return pAigTotal;
}